

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
EnrichableAnalyzerSubprocess::EmitBubble
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnrichableAnalyzerSubprocess *this,U64 packetId,U64 frameIndex,
          Frame *frame,string *channelName)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  string value;
  stringstream outputStream;
  char bubbleText [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 *local_2e0;
  uint local_2d8;
  undefined1 local_2d0 [16];
  stringstream local_2c0 [16];
  long local_2b0 [3];
  uint auStack_298 [22];
  ios_base local_240 [264];
  char local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->enabled == true) && (this->featureBubble == true)) {
    std::__cxx11::stringstream::stringstream(local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"bubble",6);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long_long>((longlong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long_long>((longlong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2b0);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,(channelName->_M_dataplus)._M_p,channelName->_M_string_length);
    local_138[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2b0);
    local_138[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,1);
    std::__cxx11::stringbuf::str();
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&subprocessLock);
    if (iVar1 != 0) {
      uVar3 = std::__throw_system_error(iVar1);
      std::__cxx11::stringstream::~stringstream(local_2c0);
      std::ios_base::~ios_base(local_240);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__return_storage_ptr__);
      _Unwind_Resume(uVar3);
    }
    write(this->outpipefd[1],local_2e0,(ulong)local_2d8);
    while( true ) {
      GetInputLine(this,local_138,0x100);
      if (local_138[0] == '\0') break;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      sVar2 = strlen(local_138);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_300,local_138,local_138 + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&subprocessLock);
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0);
    }
    std::__cxx11::stringstream::~stringstream(local_2c0);
    std::ios_base::~ios_base(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> EnrichableAnalyzerSubprocess::EmitBubble(U64 packetId, U64 frameIndex, Frame& frame, std::string channelName) {
	std::vector<std::string> bubbles;

	if(! (enabled && featureBubble)) {
		return bubbles;
	}

	std::stringstream outputStream;
	outputStream << BUBBLE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << packetId;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frameIndex;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mStartingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mEndingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mType;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mFlags;
	outputStream << UNIT_SEPARATOR;
	outputStream << channelName;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mData1;
	outputStream << LINE_SEPARATOR;
	std::string value = outputStream.str();

	LockSubprocess();
	SendOutputLine(value.c_str(), value.length());
	char bubbleText[256];
	while(true) {
		GetInputLine(
			bubbleText,
			256
		);
		if(strlen(bubbleText) > 0) {
			bubbles.push_back(bubbleText);
		} else {
			break;
		}
	}
	UnlockSubprocess();

	return bubbles;
}